

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_options_common<char>::~basic_json_options_common
          (basic_json_options_common<char> *this)

{
  this->_vptr_basic_json_options_common = (_func_int **)&PTR__basic_json_options_common_00997ba0;
  std::__cxx11::string::~string((string *)&this->neginf_to_str_);
  std::__cxx11::string::~string((string *)&this->inf_to_str_);
  std::__cxx11::string::~string((string *)&this->nan_to_str_);
  std::__cxx11::string::~string((string *)&this->neginf_to_num_);
  std::__cxx11::string::~string((string *)&this->inf_to_num_);
  std::__cxx11::string::~string((string *)&this->nan_to_num_);
  return;
}

Assistant:

virtual ~basic_json_options_common() = default;